

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

bool __thiscall
GGSock::Serialize::operator()
          (Serialize *this,vector<char,_std::allocator<char>_> *t,SerializationBuffer *buffer,
          size_t *offset)

{
  bool bVar1;
  size_type sVar2;
  const_iterator this_00;
  reference obj;
  vector<char,_std::allocator<char>_> *in_RSI;
  SerializationBuffer *in_RDI;
  char *p;
  const_iterator __end0;
  const_iterator __begin0;
  vector<char,_std::allocator<char>_> *__range2;
  int32_t n;
  bool res;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  int32_t *in_stack_ffffffffffffffb8;
  Serialize *in_stack_ffffffffffffffc0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  vector<char,_std::allocator<char>_> *local_30;
  undefined4 local_28;
  byte local_21;
  vector<char,_std::allocator<char>_> *local_10;
  
  local_21 = 1;
  local_10 = in_RSI;
  sVar2 = std::vector<char,_std::allocator<char>_>::size(in_RSI);
  local_28 = (undefined4)sVar2;
  bVar1 = operator()(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI,
                     (size_t *)in_stack_ffffffffffffffa8);
  local_21 = (local_21 & 1 & bVar1) != 0;
  local_30 = local_10;
  local_38._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffffa8);
  this_00 = std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> *
                       )in_RDI,(__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    obj = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
          operator*(&local_38);
    bVar1 = operator()((Serialize *)this_00._M_current,obj,in_RDI,
                       (size_t *)in_stack_ffffffffffffffa8);
    local_21 = (local_21 & 1 & bVar1) != 0;
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_38);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool Serialize::operator()(const std::vector<T> & t, SerializationBuffer & buffer, size_t & offset) {
    bool res = true;

    int32_t n = (int32_t) t.size();
    res &= operator()(n, buffer, offset);
    for (const auto & p : t) {
        res &= operator()(p, buffer, offset);
    }

    return res;
}